

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

void voc_parse_disambig(voccxdef *ctx)

{
  ulong uVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  runcxdef *ctx_00;
  uchar *puVar5;
  runsdef *prVar6;
  objnum *poVar7;
  char **ppcVar8;
  char **ppcVar9;
  char cVar10;
  objnum oVar11;
  uint uVar12;
  int iVar13;
  vocoldef *pvVar14;
  size_t sVar15;
  uchar *puVar16;
  uint16_t tmp_2;
  char *pcVar17;
  long lVar18;
  int32_t tmp;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint16_t tmp_1;
  char cVar22;
  int iVar23;
  ushort *puVar24;
  char *pcVar25;
  ulong uVar26;
  char *pcVar27;
  bool bVar28;
  uint local_1274;
  ushort *local_1270;
  uint subsiz;
  uchar local_1261;
  char **local_1260;
  char *local_1258;
  uint objsiz;
  prpnum local_1246;
  ushort local_1244;
  objnum local_1242;
  objnum local_1240;
  objnum local_123e;
  objnum local_123c;
  objnum local_123a;
  char *local_1238;
  voccxdef *local_1230;
  undefined8 local_1228;
  vocoldef *local_1220;
  ushort *local_1218;
  undefined8 local_1210;
  uchar *local_1208;
  ulong local_1200;
  char *local_11f8;
  voccxdef ctx_copy;
  
  ctx_00 = ctx->voccxrun;
  puVar5 = ctx->voc_stk_cur;
  local_1220 = (vocoldef *)voc_stk_alo(ctx,8000);
  local_1238 = (char *)voc_stk_alo(ctx,0x80);
  local_1230 = ctx;
  local_11f8 = (char *)voc_stk_alo(ctx,0x80);
  prVar6 = ctx_00->runcxsp;
  ctx_00->runcxsp = prVar6 + -1;
  if (prVar6[-1].runstyp != '\x02') {
LAB_001f8e15:
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx_00,0x3f2);
  }
  local_123c = prVar6[-1].runsv.runsvobj;
  ctx_00->runcxsp = prVar6 + -2;
  if (prVar6[-2].runstyp != '\x02') goto LAB_001f8e15;
  local_123e = prVar6[-2].runsv.runsvobj;
  ctx_00->runcxsp = prVar6 + -3;
  local_1240 = 0xffff;
  local_1242 = 0xffff;
  if (prVar6[-3].runstyp != '\x05') {
    if (prVar6[-3].runstyp != '\x02') goto LAB_001f8e15;
    local_1242 = prVar6[-3].runsv.runsvobj;
  }
  ctx_00->runcxsp = prVar6 + -4;
  if (prVar6[-4].runstyp != '\x05') {
    if (prVar6[-4].runstyp != '\x02') goto LAB_001f8e15;
    local_1240 = prVar6[-4].runsv.runsvobj;
  }
  ctx_00->runcxsp = prVar6 + -5;
  if (prVar6[-5].runstyp != '\x01') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx_00,0x3eb);
  }
  local_1244 = 10;
  if (prVar6[-5].runsv.runsvnum == 3) {
    local_1246 = 0x29;
  }
  else {
    local_1246 = 0x15;
    if (prVar6[-5].runsv.runsvnum == 2) {
      local_1244 = 0xb;
      local_1246 = 0x16;
    }
  }
  ctx_00->runcxsp = prVar6 + -6;
  if (prVar6[-6].runstyp != '\r') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx_00,0x3f4);
  }
  oVar11 = prVar6[-6].runsv.runsvobj;
  ctx_00->runcxsp = prVar6 + -7;
  local_1208 = puVar5;
  if (prVar6[-7].runstyp != '\a') {
LAB_001f8e2c:
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx_00,0x3fc);
  }
  puVar24 = (ushort *)prVar6[-7].runsv.runsvstr;
  uVar3 = *puVar24;
  ctx_00->runcxsp = prVar6 + -8;
  local_123a = oVar11;
  if (prVar6[-8].runstyp != '\a') goto LAB_001f8e2c;
  objsiz = *(ushort *)prVar6[-8].runsv.runsvstr - 2;
  local_1218 = (ushort *)((long)prVar6[-8].runsv.runsvstr + 2);
  ctx_00->runcxsp = prVar6 + -9;
  local_1261 = prVar6[-9].runstyp;
  if (local_1261 == '\b') {
    local_1210 = 1;
  }
  else {
    local_1210 = 0;
    if (local_1261 != '\x05') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3ed);
    }
  }
  uVar19 = uVar3 - 2;
  puVar24 = puVar24 + 1;
  uVar26 = 0;
  local_1274 = uVar19;
  local_1270 = puVar24;
  while (local_1274 != 0) {
    uVar26 = (ulong)((int)uVar26 + (uint)((char)*local_1270 == '\x03'));
    lstadv((uchar **)&local_1270,&local_1274);
  }
  local_1260 = (char **)voc_stk_alo(local_1230,(int)uVar26 * 8 + 8);
  iVar20 = 0;
  pcVar25 = local_1238;
  local_1274 = uVar19;
  local_1270 = puVar24;
  local_1200 = uVar26;
  while (local_1274 != 0) {
    if ((char)*local_1270 == '\x03') {
      local_1260[iVar20] = pcVar25;
      uVar3 = *(ushort *)((long)local_1270 + 1);
      uVar26 = (ulong)(uVar3 - 2);
      memcpy(pcVar25,(char *)((long)local_1270 + 3),uVar26);
      pcVar25[uVar26] = '\0';
      pcVar25 = pcVar25 + (uVar3 - 1);
      iVar20 = iVar20 + 1;
    }
    lstadv((uchar **)&local_1270,&local_1274);
  }
  local_1260[iVar20] = (char *)0x0;
  iVar20 = 0;
  if (objsiz == 0) {
    uVar19 = 0;
  }
  else {
    uVar19 = objsiz;
    if ((char)*local_1218 == '\x01') {
      lstadv((uchar **)&local_1218,&objsiz);
      uVar19 = objsiz;
    }
  }
  local_1274 = uVar19;
  local_1270 = local_1218;
  while (local_1274 != 0) {
    if ((char)*local_1270 == '\a') {
      subsiz = *(ushort *)((long)local_1270 + 1) - 2;
      ctx_copy.voccxerr = (errcxdef *)((long)local_1270 + 3);
      while (subsiz != 0) {
        if ((*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x05') ||
           (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x02')) {
          iVar20 = iVar20 + 1;
        }
        lstadv((uchar **)&ctx_copy,&subsiz);
      }
    }
    lstadv((uchar **)&local_1270,&local_1274);
  }
  pvVar14 = (vocoldef *)voc_stk_alo(local_1230,iVar20 * 0x28 + 0x28);
  local_1270 = local_1218;
  local_1274 = objsiz;
  iVar20 = 0;
  local_1228 = (char *)((ulong)local_1228._4_4_ << 0x20);
  while (local_1274 != 0) {
    if ((char)*local_1270 == '\a') {
      ctx_copy.voccxerr = (errcxdef *)((long)local_1270 + 3);
      subsiz = *(ushort *)((long)local_1270 + 1) - 2;
      if (subsiz == 0) {
        iVar13 = 0;
LAB_001f8983:
        local_1258 = (char *)0x0;
      }
      else {
        iVar13 = 0;
        if (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x01') {
          iVar13 = *(int *)(local_1270 + 2) + -1;
          if ((int)local_1200 <= iVar13) {
            iVar13 = (int)local_1200;
          }
          if (*(int *)(local_1270 + 2) < 1) {
            iVar13 = 0;
          }
          lstadv((uchar **)&ctx_copy,&subsiz);
          if (subsiz == 0) goto LAB_001f8983;
        }
        if (*(char *)&(ctx_copy.voccxerr)->errcxptr != '\x01') goto LAB_001f8983;
        iVar4 = *(int *)((long)&(ctx_copy.voccxerr)->errcxptr + 1);
        iVar23 = iVar4 + -1;
        if ((int)local_1200 <= iVar23) {
          iVar23 = (int)local_1200;
        }
        if (iVar4 <= iVar13) {
          iVar23 = iVar13;
        }
        lstadv((uchar **)&ctx_copy,&subsiz);
        local_1258 = (char *)(long)iVar23;
      }
      while (subsiz != 0) {
        if (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x05') {
          oVar11 = 0xffff;
LAB_001f89c6:
          pvVar14[iVar20].vocolobj = oVar11;
          pvVar14[iVar20].vocolfst = local_1260[iVar13];
          pvVar14[iVar20].vocollst = local_1260[(long)local_1258];
          lstadv((uchar **)&ctx_copy,&subsiz);
          if ((subsiz == 0) || (*(char *)&(ctx_copy.voccxerr)->errcxptr != '\x01')) {
            pvVar14[iVar20].vocolflg = 0;
            uVar12 = 0;
          }
          else {
            pvVar14[iVar20].vocolflg = *(int *)((long)&(ctx_copy.voccxerr)->errcxptr + 1);
            lstadv((uchar **)&ctx_copy,&subsiz);
            uVar12 = (uint)pvVar14[iVar20].vocolflg >> 0xb & 1;
          }
          local_1228 = (char *)CONCAT44(local_1228._4_4_,(int)local_1228 + uVar12);
          iVar20 = iVar20 + 1;
        }
        else {
          if (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x02') {
            oVar11 = *(objnum *)((long)&(ctx_copy.voccxerr)->errcxptr + 1);
            goto LAB_001f89c6;
          }
          lstadv((uchar **)&ctx_copy,&subsiz);
        }
      }
    }
    lstadv((uchar **)&local_1270,&local_1274);
  }
  pvVar14[iVar20].vocolobj = 0xffff;
  pvVar14[iVar20].vocolflg = 0;
  memcpy(&ctx_copy,local_1230,0x11c0);
  ctx_copy.voccxlastunk = (int)local_1228;
  ctx_copy.voccxunknown = (int)local_1228;
  pcVar25 = (char *)(ulong)local_1244;
  iVar20 = vocdisambig(&ctx_copy,local_1220,pvVar14,local_1244,local_1246,local_123a,local_1260,
                       local_1240,local_123c,local_123e,local_1242,local_1238,(int)local_1210);
  if (((local_1261 != '\b') && (iVar20 == 2)) && (ctx_copy.voccxunknown != 0)) {
    ctx_copy.voccxunknown = 0;
    for (uVar26 = 0; pcVar17 = local_1260[uVar26], pcVar17 != (char *)0x0; uVar26 = uVar26 + 1) {
      sVar15 = strlen(pcVar17);
      pcVar25 = (char *)0x1;
      iVar13 = voc_lookup_type(local_1230,pcVar17,(int)sVar15,1);
      if (iVar13 == 0) {
        pcVar17 = local_1260[uVar26];
        if (pcVar17 != (char *)0x0) goto LAB_001f8b62;
        break;
      }
    }
    pcVar17 = *local_1260;
    uVar26 = 0;
LAB_001f8b62:
    pcVar27 = local_11f8;
    local_1258 = voc_read_oops(&ctx_copy,local_11f8,(size_t)pcVar17,pcVar25);
    if (local_1258 != (char *)0x0) {
      local_1228 = local_1238 + 0x80;
      pcVar25 = local_1238;
      uVar21 = 0;
      while (ppcVar8 = local_1260, pcVar17 = local_1260[uVar21], pcVar17 != (char *)0x0) {
        pcVar27 = pcVar17;
        if (uVar21 == (uVar26 & 0xffffffff)) {
          pcVar27 = local_1258;
        }
        sVar15 = strlen(pcVar27);
        ppcVar9 = local_1260;
        if ((ulong)((long)local_1228 - (long)pcVar25) <
            sVar15 + (sVar15 != 0 && ppcVar8[uVar21 + 1] != (char *)0x0) + 1) break;
        pcVar27 = local_1258;
        if ((uVar21 == (uVar26 & 0xffffffff)) || (pcVar27 = pcVar17, *pcVar17 != '\"')) {
          strcpy(pcVar25,pcVar27);
        }
        else {
          pcVar27 = pcVar17 + 2;
          cVar10 = pcVar17[1];
          do {
            cVar22 = '\"';
            if ((cVar10 == '\0') || (cVar2 = *pcVar27, cVar2 == '\0')) goto LAB_001f8c26;
            pcVar27 = pcVar27 + 1;
            bVar28 = cVar10 != '\"';
            cVar10 = cVar2;
          } while (bVar28);
          cVar22 = '\'';
LAB_001f8c26:
          *pcVar25 = cVar22;
          pcVar25 = pcVar25 + 1;
          pcVar17 = local_1260[uVar21];
          sVar15 = strlen(pcVar17);
          if (2 < sVar15) {
            memcpy(pcVar25,pcVar17 + 1,sVar15 - 2);
            sVar15 = strlen(ppcVar9[uVar21]);
            pcVar25 = pcVar25 + (sVar15 - 2);
          }
          *pcVar25 = cVar22;
          pcVar25[1] = '\0';
          pcVar25 = pcVar25 + 1;
        }
        uVar1 = uVar21 + 1;
        sVar15 = strlen(pcVar25);
        pcVar25 = pcVar25 + sVar15;
        lVar18 = uVar21 + 1;
        uVar21 = uVar1;
        if (local_1260[lVar18] != (char *)0x0) {
          *pcVar25 = ' ';
          pcVar25 = pcVar25 + 1;
        }
      }
      *pcVar25 = '\0';
      uVar26 = 0;
      iVar20 = 0x2d;
      goto LAB_001f8cfb;
    }
    ctx_copy.voccxredo = 1;
    strcpy(local_1238,pcVar27);
  }
  if ((iVar20 == 0x2c) || (uVar26 = 0, iVar20 == 0)) {
    uVar26 = 0xffffffffffffffff;
    pvVar14 = local_1220;
    do {
      uVar26 = (ulong)((int)uVar26 + 1);
      poVar7 = &pvVar14->vocolobj;
      pvVar14 = pvVar14 + 1;
    } while (*poVar7 != 0xffff);
  }
LAB_001f8cfb:
  iVar13 = ctx_copy.voccxredo;
  local_1274 = (int)uVar26 * 3 + 5;
  if (iVar20 == 0x2d || ctx_copy.voccxredo != 0) {
    sVar15 = strlen(local_1238);
    local_1274 = (int)uVar26 * 3 + (int)sVar15 + 8;
    if (iVar13 != 0) {
      iVar20 = 0x2b;
    }
  }
  puVar5 = local_1208;
  puVar16 = voc_push_list_siz(local_1230,local_1274);
  pcVar25 = local_1238;
  *puVar16 = '\x01';
  *(int *)(puVar16 + 1) = iVar20;
  if ((iVar20 == 0x2c) || (iVar20 == 0)) {
    puVar16 = puVar16 + 5;
    for (lVar18 = 0; uVar26 * 0x28 - lVar18 != 0; lVar18 = lVar18 + 0x28) {
      *puVar16 = '\x02';
      *(undefined2 *)(puVar16 + 1) = *(undefined2 *)((long)&local_1220->vocolobj + lVar18);
      puVar16 = puVar16 + 3;
    }
  }
  else if ((iVar20 == 0x2d) || (ctx_copy.voccxredo != 0)) {
    local_1270 = (ushort *)(puVar16 + 6);
    puVar16[5] = '\x03';
    sVar15 = strlen(local_1238);
    *local_1270 = (short)sVar15 + 2;
    memcpy(local_1270 + 1,pcVar25,sVar15 & 0xffffffff);
  }
  local_1230->voc_stk_cur = puVar5;
  return;
}

Assistant:

void voc_parse_disambig(voccxdef *ctx)
{
    voccxdef ctx_copy;
    uchar *save_sp;
    runcxdef *rcx = ctx->voccxrun;
    vocoldef *inlist;
    vocoldef *outlist;
    int objcnt;
    char **cmd;
    char *cmdbuf;
    char *oopsbuf;
    objnum actor;
    objnum verb;
    objnum prep;
    objnum otherobj;
    prpnum defprop;
    prpnum accprop;
    prpnum verprop;
    uchar *tokp;
    uint toksiz;
    uchar *objp;
    uint objsiz;
    uchar *lstp;
    uint lstsiz;
    int tokcnt;
    char *p;
    int i;
    int silent;
    int err;
    int unknown_count;

    /* allocate our stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, outlist);
    VOC_STK_ARRAY(ctx, char,     cmdbuf, VOCBUFSIZ);
    VOC_STK_ARRAY(ctx, char,     oopsbuf, VOCBUFSIZ);

    /* get the actor, verb, prep, and otherobj arguments */
    actor = runpopobj(rcx);
    verb = runpopobj(rcx);
    prep = runpopobjnil(rcx);
    otherobj = runpopobjnil(rcx);

    /* 
     *   get the usage parameter, and use it to select the appropriate
     *   defprop and accprop 
     */
    switch(runpopnum(rcx))
    {
    case VOC_PRO_RESOLVE_DOBJ:
    default:
        defprop = PRP_DODEFAULT;
        accprop = PRP_VALIDDO;
        break;

    case VOC_PRO_RESOLVE_IOBJ:
        defprop = PRP_IODEFAULT;
        accprop = PRP_VALIDIO;
        break;

    case VOC_PRO_RESOLVE_ACTOR:
        defprop = PRP_DODEFAULT;
        accprop = PRP_VALIDACTOR;
        break;
    }
    
    /* get the verprop argument */
    verprop = runpopprp(rcx);

    /* pop the token list, and read and skip the length prefix */
    tokp = runpoplst(rcx);
    toksiz = osrp2(tokp) - 2;
    tokp += 2;

    /* pop the object list, and read and skip the length prefix */
    objp = runpoplst(rcx);
    objsiz = osrp2(objp) - 2;
    objp += 2;

    /* pop the "silent" flag */
    silent = runpoplog(rcx);

    /* count the tokens */
    for (lstp = tokp, lstsiz = toksiz, tokcnt = 0 ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* if this is a string, count it */
        if (*lstp == DAT_SSTRING)
            ++tokcnt;
    }

    /* allocate stack space for the command pointers and buffer */
    VOC_STK_ARRAY(ctx, char *, cmd, tokcnt + 1);

    /* extract the tokens into our pointer buffer */
    for (lstp = tokp, lstsiz = toksiz, i = 0, p = cmdbuf ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* if this is a string, count and size it */
        if (*lstp == DAT_SSTRING)
        {
            uint len;
            
            /* store a pointer to the word in the command buffer */
            cmd[i++] = p;

            /* copy the token into the command buffer and null-terminate it */
            len = osrp2(lstp + 1) - 2;
            memcpy(p, lstp + 3, len);
            p[len] = '\0';

            /* move the buffer pointer past this word */
            p += len + 1;
        }
    }

    /* store a null at the end of the command pointer list */
    cmd[i] = 0;

    /*
     *   The object list is provided in the same format as the list
     *   returned by voc_parse_np(), but the leading index number is
     *   optional.  We don't need the leading index for anything, so if
     *   it's there, simply skip it so that we can start with the first
     *   sublist.  
     */
    if (objsiz > 0 && *objp == DAT_NUMBER)
        lstadv(&objp, &objsiz);

    /*
     *   Count the objects in the object list, so that we can figure out
     *   how much we need to allocate for the input object list.  
     */
    for (lstp = objp, lstsiz = objsiz, objcnt = 0 ; lstsiz != 0 ;
         lstadv(&lstp, &lstsiz))
    {
        /* if this is a sublist, parse it */
        if (*lstp == DAT_LIST)
        {
            uchar *subp;
            uint subsiz;

            /* get the sublist pointer, and read and skip the size prefix */
            subp = lstp + 1;
            subsiz = osrp2(subp) - 2;
            subp += 2;

            /* scan the sublist */
            while (subsiz > 0)
            {
                /* if this is an object, count it */
                if (*subp == DAT_OBJECT || *subp == DAT_NIL)
                    ++objcnt;

                /* skip this element */
                lstadv(&subp, &subsiz);
            }
        }
    }

    /* allocate space for the input list */
    VOC_STK_ARRAY(ctx, vocoldef, inlist, objcnt + 1);

    /* we don't have any unknown words yet */
    unknown_count = 0;

    /* parse the list, filling in the input array */
    for (lstp = objp, lstsiz = objsiz, i = 0 ; lstsiz != 0 ;
         lstadv(&lstp, &lstsiz))
    {
        /* if this is a sublist, parse it */
        if (*lstp == DAT_LIST)
        {
            uchar *subp;
            uint subsiz;
            int firstwrd, lastwrd;

            /* get the sublist pointer, and read and skip the size prefix */
            subp = lstp + 1;
            subsiz = osrp2(subp) - 2;
            subp += 2;

            /* in case we don't find token indices, clear them */
            firstwrd = 0;
            lastwrd = 0;

            /* 
             *   the first two elements of the list are the token indices
             *   of the first and last words of this object's noun phrase 
             */
            if (subsiz > 0 && *subp == DAT_NUMBER)
            {
                /* read the first index, adjusting to zero-based indexing */
                firstwrd = (int)osrp4(subp+1) - 1;

                /* make sure it's in range */
                if (firstwrd < 0)
                    firstwrd = 0;
                else if (firstwrd > tokcnt)
                    firstwrd = tokcnt;

                /* skip it */
                lstadv(&subp, &subsiz);
            }
            if (subsiz > 0 && *subp == DAT_NUMBER)
            {
                /* read the last index, adjusting to zero-based indexing */
                lastwrd = (int)osrp4(subp+1) - 1;

                /* make sure it's in range */
                if (lastwrd < firstwrd)
                    lastwrd = firstwrd;
                else if (lastwrd > tokcnt)
                    lastwrd = tokcnt;

                /* skip it */
                lstadv(&subp, &subsiz);
            }

            /* scan the sublist */
            while (subsiz > 0)
            {
                /* if this is an object, store it */
                if (*subp == DAT_OBJECT || *subp == DAT_NIL)
                {
                    /* store the object */
                    if (*subp == DAT_OBJECT)
                        inlist[i].vocolobj = osrp2(subp+1);
                    else
                        inlist[i].vocolobj = MCMONINV;

                    /* set the first and last word pointers */
                    inlist[i].vocolfst = cmd[firstwrd];
                    inlist[i].vocollst = cmd[lastwrd];

                    /* skip the object */
                    lstadv(&subp, &subsiz);

                    /* check for flags */
                    if (subsiz > 0 && *subp == DAT_NUMBER)
                    {
                        /* get the flags value */
                        inlist[i].vocolflg = (int)osrp4(subp+1);

                        /* skip the number in the list */
                        lstadv(&subp, &subsiz);
                    }
                    else
                    {
                        /* clear the flags */
                        inlist[i].vocolflg = 0;
                    }

                    /* if an unknown word was involved, note it */
                    if ((inlist[i].vocolflg & VOCS_UNKNOWN) != 0)
                        ++unknown_count;

                    /* consume the element */
                    ++i;
                }
                else
                {
                    /* skip this element */
                    lstadv(&subp, &subsiz);
                }
            }
        }
    }

    /* terminate the list */
    inlist[i].vocolobj = MCMONINV;
    inlist[i].vocolflg = 0;

    /* 
     *   make a copy of our context, so the disambiguation can't make any
     *   global changes 
     */
    memcpy(&ctx_copy, ctx, sizeof(ctx_copy));

    /*
     *   Count the unknown words and set the count in the context.  This
     *   will allow us to determine after we call the resolver whether the
     *   resolution process cleared up the unknown words (via
     *   parseUnknownDobj/Iobj). 
     */
    ctx_copy.voccxunknown = ctx_copy.voccxlastunk = unknown_count;

    /* disambiguate the noun list */
    err = vocdisambig(&ctx_copy, outlist, inlist,
                      defprop, accprop, verprop, cmd,
                      otherobj, actor, verb, prep, cmdbuf, silent);

    /*
     *   If the error was VOCERR(2) - unknown word - check the input list
     *   to see if it contained any unknown words.  If it does, and we're
     *   not in "silent" mode, flag the error and then give the user a
     *   chance to use "oops" to correct the problem.  If we're in silent
     *   mode, don't display an error and don't allow interactive
     *   correction via "oops."
     *   
     *   It is possible that the unknown word is not in the input list,
     *   but in the user's response to an interactive disambiguation
     *   query.  This is why we must check to see if the unknown word is
     *   in the original input list or not.
     */
    if (err == VOCERR(2) && ctx_copy.voccxunknown != 0 && !silent)
    {
        char *unk;
        int unk_idx;
        char *rpl_text;

        /* 
         *   forget we have unknown words, since we're going to handle
         *   them now
         */
        ctx_copy.voccxunknown = 0;

        /* 
         *   find the unknown word - look up each word until we find one
         *   that's not in the dictionary 
         */
        for (i = 0, unk = 0 ; cmd[i] != 0 ; ++i)
        {
            int t;
            
            /* 
             *   get this word's type - if the word has no type, it's an
             *   unknown word 
             */
            t = voc_lookup_type(ctx, cmd[i], strlen(cmd[i]), TRUE);
            if (t == 0)
            {
                /* this is it - note it and stop searching */
                unk_idx = i;
                unk = cmd[i];
                break;
            }
        }

        /* 
         *   if we didn't find any unknown words, assume the first word
         *   was unknown 
         */
        if (unk == 0)
        {
            unk_idx = 0;
            unk = cmd[0];
        }

        /* display an error, and read a new command */
        rpl_text = voc_read_oops(&ctx_copy, oopsbuf, VOCBUFSIZ, unk);

        /* 
         *   if they didn't respond with "oops," treat the response as a
         *   brand new command to replace the current command 
         */
        if (rpl_text == 0)
        {
            /* 
             *   it's a replacement command - set the redo flag to
             *   indicate that we should process the replacement command 
             */
            ctx_copy.voccxredo = TRUE;

            /* copy the response into the command buffer */
            strcpy(cmdbuf, oopsbuf);
        }
        else
        {
            /* indicate the correction via the result code */
            err = VOCERR(45);

            /* 
             *   Build the new command string.  The new command string
             *   consists of all of the tokens up to the unknown token,
             *   then the replacement text, then all of the remaining
             *   tokens. 
             */
            for (p = cmdbuf, i = 0 ; cmd[i] != 0 ; ++i)
            {
                size_t needed;
                
                /* figure the size needs for this token */
                if (i == unk_idx)
                {
                    /* we need to insert the replacement text */
                    needed = strlen(rpl_text);
                }
                else
                {
                    /* we need to insert this token string */
                    needed = strlen(cmd[i]);
                }
                
                /* 
                 *   if more tokens follow, we need a space after the
                 *   replacement text to separate it from what follows 
                 */
                if (cmd[i+1] != 0 && needed != 0)
                    needed += 1;

                /* leave room for null termination */
                needed += 1;

                /* if we don't have room for this token, stop now */
                if (needed > (size_t)(VOCBUFSIZ - (p - cmdbuf)))
                    break;

                /* 
                 *   if we've reached the unknown token, insert the
                 *   replacement text; otherwise, insert this token
                 */
                if (i == unk_idx)
                {
                    /* insert the replacement text */
                    strcpy(p, rpl_text);
                }
                else if (*cmd[i] == '"')
                {
                    char *p1;
                    char qu;
                    
                    /* 
                     *   Scan the quoted string for embedded double quotes
                     *   - if it has any, use single quotes as the
                     *   delimiter; otherwise, use double quotes as the
                     *   delimiter.  Note that we ignore the first and
                     *   last characters in the string, since these are
                     *   always the delimiting double quotes in the
                     *   original token text.  
                     */
                    for (qu = '"', p1 = cmd[i] + 1 ;
                         *p1 != '\0' && *(p1 + 1) != '\0' ; ++p1)
                    {
                        /* check for an embedded double quote */
                        if (*p1 == '"')
                        {
                            /* switch to single quotes as delimiters */
                            qu = '\'';

                            /* no need to look any further */
                            break;
                        }
                    }

                    /* add the open quote */
                    *p++ = qu;

                    /* 
                     *   add the text, leaving out the first and last
                     *   characters (which are the original quotes) 
                     */
                    if (strlen(cmd[i]) > 2)
                    {
                        memcpy(p, cmd[i] + 1, strlen(cmd[i]) - 2);
                        p += strlen(cmd[i]) - 2;
                    }

                    /* add the closing quote */
                    *p++ = qu;

                    /* null-terminate here so we don't skip any further */
                    *p = '\0';
                }
                else
                {
                    /* copy this word */
                    strcpy(p, cmd[i]);
                }

                /* move past this token */
                p += strlen(p);

                /* add a space if another token follows */
                if (cmd[i+1] != 0)
                    *p++ = ' ';
            }

            /* null-terminate the replacement text */
            *p = '\0';
        }
    }

    /* 
     *   Count the objects.  An object list is returned only on success or
     *   VOCERR(44), which indicates that the list is still ambiguous. 
     */
    if (err == 0 || err == VOCERR(44))
    {
        /* count the objects in the list */
        for (i = 0 ; outlist[i].vocolobj != MCMONINV ; ++i) ;
        objcnt = i;
    }
    else
    {
        /* there's nothing in the list */
        objcnt = 0;
    }

    /* figure out how much space we need for the objects */
    lstsiz = (1+2) * objcnt;
        
    /* add space for the first element, which contains the status code */
    lstsiz += (1 + 4);

    /* if there's a new command string, we'll store it, so make room */
    if (ctx_copy.voccxredo || err == VOCERR(45))
    {
        /* 
         *   add space for the type prefix (1), length prefix (2), and the
         *   string bytes (with no null terminator, of course) 
         */
        lstsiz += (1 + 2 + strlen(cmdbuf));

        /* 
         *   if we're retrying due to the redo flag, always return the
         *   RETRY error code, regardless of what caused us to retry the
         *   command 
         */
        if (ctx_copy.voccxredo)
            err = VOCERR(43);
    }

    /* push a list with space for the objects */
    lstp = voc_push_list_siz(ctx, lstsiz);

    /* store the status code in the first element */
    *lstp++ = DAT_NUMBER;
    oswp4s(lstp, err);
    lstp += 4;

    /* store the remainder of the list */
    if (err == 0 || err == VOCERR(44))
    {
        /* fill in the list with the objects */
        for (i = 0 ; i < objcnt ; ++i)
        {
            /* set this element */
            *lstp++ = DAT_OBJECT;
            oswp2(lstp, outlist[i].vocolobj);
            lstp += 2;
        }
    }
    else if (ctx_copy.voccxredo || err == VOCERR(45))
    {
        uint len;
        
        /* there's a new command - return it as the second element */
        *lstp++ = DAT_SSTRING;

        /* store the length */
        len = strlen(cmdbuf);
        oswp2(lstp, len + 2);
        lstp += 2;

        /* store the string */
        memcpy(lstp, cmdbuf, len);
    }

    /* leave the stack frame */
    voc_leave(ctx, save_sp);
}